

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bws.c
# Opt level: O0

void nn_bws_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  nn_list_item *pnVar2;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  nn_aws *aws;
  nn_list_item *it;
  nn_bws *bws;
  nn_list_item *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  long local_38;
  nn_list_item *local_28;
  
  local_38 = in_RDI;
  if (in_RDI == 0) {
    local_38 = 0;
  }
  if ((in_ESI == 0xfffffffe) && (in_EDX == 0xfffffffd)) {
    if (*(long *)(local_38 + 0x2c8) == 0) {
      *(undefined4 *)(local_38 + 0x58) = 4;
    }
    else {
      nn_aws_stop((nn_aws *)0x1440ab);
      *(undefined4 *)(local_38 + 0x58) = 3;
    }
  }
  if (*(int *)(local_38 + 0x58) == 3) {
    iVar1 = nn_aws_isidle((nn_aws *)0x1440e3);
    if (iVar1 == 0) {
      return;
    }
    nn_aws_term((nn_aws *)0x1440fe);
    nn_free((void *)0x14410f);
    *(undefined8 *)(local_38 + 0x2c8) = 0;
    nn_usock_stop((nn_usock *)0x14412d);
    *(undefined4 *)(local_38 + 0x58) = 4;
  }
  if (*(int *)(local_38 + 0x58) == 4) {
    iVar1 = nn_usock_isidle((nn_usock *)0x144156);
    if (iVar1 == 0) {
      return;
    }
    local_28 = nn_list_begin((nn_list *)(local_38 + 0x2d0));
    while (pnVar2 = nn_list_end((nn_list *)(local_38 + 0x2d0)), local_28 != pnVar2) {
      nn_aws_stop((nn_aws *)0x1441d5);
      local_28 = nn_list_next((nn_list *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              in_stack_ffffffffffffff98);
    }
    *(undefined4 *)(local_38 + 0x58) = 5;
  }
  else {
    if (*(int *)(local_38 + 0x58) != 5) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)(local_38 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/bws.c"
              ,0xee);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_ESI != 2 || in_EDX != 0x85b9) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
              "src == NN_BWS_SRC_AWS && type == NN_AWS_STOPPED",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/bws.c"
              ,0xdb);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_list_erase((nn_list *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                  in_stack_ffffffffffffff98);
    nn_aws_term((nn_aws *)0x1442bb);
    nn_free((void *)0x1442c5);
  }
  iVar1 = nn_list_empty((nn_list *)(local_38 + 0x2d0));
  if (iVar1 != 0) {
    *(undefined4 *)(local_38 + 0x58) = 1;
    nn_fsm_stopped_noevent((nn_fsm *)0x1442f1);
    nn_ep_stopped((nn_ep *)0x1442ff);
  }
  return;
}

Assistant:

static void nn_bws_shutdown (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_bws *bws;
    struct nn_list_item *it;
    struct nn_aws *aws;

    bws = nn_cont (self, struct nn_bws, fsm);

    if (src == NN_FSM_ACTION && type == NN_FSM_STOP) {
        if (bws->aws) {
            nn_aws_stop (bws->aws);
            bws->state = NN_BWS_STATE_STOPPING_AWS;
        }
        else {
            bws->state = NN_BWS_STATE_STOPPING_USOCK;
        }
    }
    if (bws->state == NN_BWS_STATE_STOPPING_AWS) {
        if (!nn_aws_isidle (bws->aws))
            return;
        nn_aws_term (bws->aws);
        nn_free (bws->aws);
        bws->aws = NULL;
        nn_usock_stop (&bws->usock);
        bws->state = NN_BWS_STATE_STOPPING_USOCK;
    }
    if (bws->state == NN_BWS_STATE_STOPPING_USOCK) {
       if (!nn_usock_isidle (&bws->usock))
            return;
        for (it = nn_list_begin (&bws->awss);
              it != nn_list_end (&bws->awss);
              it = nn_list_next (&bws->awss, it)) {
            aws = nn_cont (it, struct nn_aws, item);
            nn_aws_stop (aws);
        }
        bws->state = NN_BWS_STATE_STOPPING_AWSS;
        goto awss_stopping;
    }
    if (bws->state == NN_BWS_STATE_STOPPING_AWSS) {
        nn_assert (src == NN_BWS_SRC_AWS && type == NN_AWS_STOPPED);
        aws = (struct nn_aws *) srcptr;
        nn_list_erase (&bws->awss, &aws->item);
        nn_aws_term (aws);
        nn_free (aws);

        /*  If there are no more aws state machines, we can stop the whole
            bws object. */
awss_stopping:
        if (nn_list_empty (&bws->awss)) {
            bws->state = NN_BWS_STATE_IDLE;
            nn_fsm_stopped_noevent (&bws->fsm);
            nn_ep_stopped (bws->ep);
            return;
        }

        return;
    }

    nn_fsm_bad_action (bws->state, src, type);
}